

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O1

void shade_round(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Color FVar4;
  uchar *puVar5;
  size_t sVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong local_c8;
  ulong local_c0;
  char *local_98;
  char *local_90;
  
  local_c8 = (ulong)(uint)h;
  local_c0 = (ulong)(uint)w;
  uVar13 = (ulong)(uint)y;
  uVar11 = (ulong)(uint)x;
  puVar5 = fl_gray_ramp();
  sVar6 = strlen(c);
  uVar7 = (int)sVar6 - 1;
  uVar8 = ((int)sVar6 - ((int)uVar7 >> 0x1f)) + -1 >> 1;
  if (h < w) {
    iVar14 = h / 2;
    if (1 < (int)uVar7) {
      iVar2 = w + x;
      iVar12 = iVar2 - iVar14;
      local_90 = c + uVar7;
      iVar3 = h + -1;
      uVar7 = 0xe1;
      uVar13 = 0;
      do {
        iVar1 = (int)uVar13;
        uVar16 = x + iVar1;
        uVar15 = y + iVar1;
        FVar4 = fl_color_average((uint)puVar5[c[uVar13]],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0x4056800000000000,fl_graphics_driver,(ulong)uVar16,(ulong)uVar15,local_c8,
                   local_c8);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,(ulong)(uint)(iVar14 + x),(ulong)uVar15,iVar12);
        uVar10 = (iVar2 - h) + iVar1;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar7 - 0xb4),0x4056800000000000,fl_graphics_driver,(ulong)uVar10,
                   (ulong)uVar15,local_c8,local_c8);
        FVar4 = fl_color_average((uint)puVar5[(long)c[uVar13] + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar7 + 0x5a),(double)(uVar7 + 0xb4),fl_graphics_driver,(ulong)uVar10,
                   (ulong)uVar15,local_c8,local_c8);
        FVar4 = fl_color_average((uint)puVar5[*local_90],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0x4070e00000000000,(double)(uVar7 + 0x5a),fl_graphics_driver,(ulong)uVar10,
                   (ulong)uVar15,local_c8,local_c8);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,(ulong)(uint)(iVar14 + x),(ulong)(uint)(iVar3 + y),iVar12);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)uVar7,0x4070e00000000000,fl_graphics_driver,(ulong)uVar16,(ulong)uVar15,
                   local_c8,local_c8);
        FVar4 = fl_color_average((uint)puVar5[(long)*local_90 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar7 - 0x5a),(double)uVar7,fl_graphics_driver,(ulong)uVar16,
                   (ulong)uVar15,local_c8,local_c8);
        uVar13 = uVar13 + 1;
        w = (int)local_c0 - 2;
        local_c0 = (ulong)(uint)w;
        local_c8 = (ulong)((int)local_c8 - 2);
        local_90 = local_90 + -1;
        uVar7 = uVar7 + 8;
        iVar3 = iVar3 + -1;
      } while (uVar8 != uVar13);
      iVar14 = iVar14 - uVar8;
      uVar11 = (ulong)(uint)(x + (int)uVar13);
      uVar13 = (ulong)(uint)(y + (int)uVar13);
    }
    FVar4 = fl_color_average((uint)puVar5[c[(int)uVar8]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
    iVar3 = (int)local_c8;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)(iVar14 + (int)uVar11),uVar13,
               (ulong)((w - iVar3) + 1),(ulong)(iVar3 + 1));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0x4056800000000000,0x4070e00000000000,fl_graphics_driver,uVar11,uVar13,local_c8,
               local_c8);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21];
    uVar11 = (ulong)(uint)(((int)uVar11 + w) - iVar3);
    uVar17 = 0x4070e00000000000;
    uVar18 = 0x4056800000000000;
  }
  else {
    iVar14 = w / 2;
    if (1 < (int)uVar7) {
      iVar3 = h + y;
      uVar10 = iVar3 - iVar14;
      local_98 = c + uVar7;
      iVar2 = w + -1;
      uVar7 = 0xe1;
      uVar13 = 0;
      do {
        iVar12 = (int)uVar13;
        uVar15 = x + iVar12;
        uVar16 = y + iVar12;
        FVar4 = fl_color_average((uint)puVar5[c[uVar13]],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (fl_graphics_driver,(ulong)uVar15,(ulong)uVar16,local_c0,local_c0);
        FVar4 = fl_color_average((uint)puVar5[(long)c[uVar13] + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0,(double)(uVar7 - 0xb4),fl_graphics_driver,(ulong)uVar15,(ulong)uVar16,local_c0,
                   local_c0);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)(uint)(x + iVar2),iVar14 + y,(ulong)uVar10);
        uVar9 = (iVar3 - w) + iVar12;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar7 + 0x5a),0x4076800000000000,fl_graphics_driver,(ulong)uVar15,
                   (ulong)uVar9,local_c0,local_c0);
        FVar4 = fl_color_average((uint)puVar5[*local_98],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)uVar7,(double)(uVar7 + 0x5a),fl_graphics_driver,(ulong)uVar15,
                   (ulong)uVar9,local_c0,local_c0);
        FVar4 = fl_color_average((uint)puVar5[(long)*local_98 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar4);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  (0x4066800000000000,(double)uVar7,fl_graphics_driver,(ulong)uVar15,(ulong)uVar9,
                   local_c0,local_c0);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)uVar15,iVar14 + y,(ulong)uVar10);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
                  ((double)(uVar7 - 0x5a),0x4066800000000000,fl_graphics_driver,(ulong)uVar15,uVar16
                   ,local_c0,local_c0);
        uVar13 = uVar13 + 1;
        local_c0 = (ulong)((int)local_c0 - 2);
        h = (int)local_c8 - 2;
        local_c8 = (ulong)(uint)h;
        local_98 = local_98 + -1;
        uVar7 = uVar7 + 8;
        iVar2 = iVar2 + -1;
      } while (uVar8 != uVar13);
      iVar14 = iVar14 - uVar8;
      uVar11 = (ulong)(uint)(x + (int)uVar13);
      uVar13 = (ulong)(uint)(y + (int)uVar13);
    }
    FVar4 = fl_color_average((uint)puVar5[c[(int)uVar8]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
    iVar3 = (int)local_c0;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,uVar11,(ulong)(uint)(iVar14 + (int)uVar13),(ulong)(iVar3 + 1),
               (ulong)((h - iVar3) + 1));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21])
              (0,0x4066800000000000,fl_graphics_driver,uVar11,uVar13,local_c0,local_c0);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x21];
    uVar18 = 0x4076800000000000;
    uVar13 = (ulong)(uint)(((int)uVar13 + h) - iVar3);
    uVar17 = 0x4066800000000000;
    local_c8 = local_c0;
  }
  (*UNRECOVERED_JUMPTABLE)(uVar17,uVar18,fl_graphics_driver,uVar11,uVar13,local_c8,local_c8);
  return;
}

Assistant:

static void shade_round(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i;
  int 	clen = (int) (strlen(c) - 1);
  int 	chalf = clen / 2;

  if (w>h) {
    int d = h/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, h, h, 90.0, 135.0+i*na);
      fl_xyline(x+d, y, x+w-d);
      fl_pie(x+w-h, y, h, h, 45.0+i*na, 90.0);
      fl_color(shade_color(g[(int)c[i] - 2], bc));
      fl_pie(x+w-h, y, h, h, 315.0+i*na, 405.0+i*na);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x+w-h, y, h, h, 270.0, 315.0+i*na);
      fl_xyline(x+d, y+h-1, x+w-d);
      fl_pie(x, y, h, h, 225.0+i*na, 270.0);
      fl_color(shade_color(g[c[(int)clen - i] - 2], bc));
      fl_pie(x, y, h, h, 135.0+i*na, 225.0+i*na);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x+d, y, w-h+1, h+1);
    fl_pie(x, y, h, h, 90.0, 270.0);
    fl_pie(x+w-h, y, h, h, 270.0, 90.0);
  } else {
    int d = w/2;
    const int na = 8;
    for (i=0; i<chalf; i++, d--, x++, y++, w-=2, h-=2)
    {
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_pie(x, y, w, w, 45.0+i*na, 135.0+i*na);
      fl_color(shade_color(g[c[i] - 2], bc));
      fl_pie(x, y, w, w, 0.0, 45.0+i*na);
      fl_yxline(x+w-1, y+d, y+h-d);
      fl_pie(x, y+h-w, w, w, 315.0+i*na, 360.0);
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_pie(x, y+h-w, w, w, 225.0+i*na, 315.0+i*na);
      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_pie(x, y+h-w, w, w, 180.0, 225.0+i*na);
      fl_yxline(x, y+d, y+h-d);
      fl_pie(x, y, w, w, 135.0+i*na, 180.0);
    }
    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x, y+d, w+1, h-w+1);
    fl_pie(x, y, w, w, 0.0, 180.0);
    fl_pie(x, y+h-w, w, w, 180.0, 360.0);
  }
}